

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataViewDefault.cpp
# Opt level: O0

bool __thiscall Rml::DataViewFor::Update(DataViewFor *this,DataModel *model)

{
  code *pcVar1;
  initializer_list<Rml::DataAddressEntry> __l;
  void *pvVar2;
  bool bVar3;
  int a;
  int b;
  int iVar4;
  size_type sVar5;
  Element *this_00;
  String *instancer_name;
  String *tag;
  pointer pEVar6;
  Element *pEVar7;
  reference ppEVar8;
  DataAddressEntry *local_230;
  undefined1 local_1e8 [16];
  Element *local_1d8;
  Element *new_element;
  vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_> local_1b8;
  allocator<Rml::DataAddressEntry> local_19b [2];
  allocator<char> local_199;
  String local_198;
  allocator<char> local_171;
  String local_170;
  DataModel *local_150;
  undefined1 local_148 [80];
  undefined1 local_f8 [48];
  pointer local_c8;
  undefined1 local_c0 [8];
  DataAddress iterator_index_address;
  undefined1 local_70 [8];
  DataAddress iterator_address;
  ElementPtr new_element_ptr;
  int i;
  Element *element;
  int num_elements;
  int size;
  bool result;
  DataVariable variable;
  DataModel *model_local;
  DataViewFor *this_local;
  
  variable.ptr = model;
  _size = DataModel::GetVariable(model,&this->container_address);
  bVar3 = DataVariable::operator_cast_to_bool((DataVariable *)&size);
  if (bVar3) {
    a = DataVariable::Size((DataVariable *)&size);
    sVar5 = ::std::vector<Rml::Element_*,_std::allocator<Rml::Element_*>_>::size(&this->elements);
    b = (int)sVar5;
    this_00 = DataView::GetElement(&this->super_DataView);
    for (new_element_ptr._M_t.super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t
         .super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
         super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl._4_4_ = 0;
        iVar4 = Math::Max<int>(a,b),
        new_element_ptr._M_t.super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
        super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
        super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl._4_4_ < iVar4;
        new_element_ptr._M_t.super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
        super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
        super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl._4_4_ =
             new_element_ptr._M_t.super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>.
             _M_t.super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
             super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl._4_4_ + 1) {
      if (b <= new_element_ptr._M_t.
               super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
               super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
               super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl._4_4_) {
        instancer_name = Element::GetTagName_abi_cxx11_(this_00);
        tag = Element::GetTagName_abi_cxx11_(this_00);
        Factory::InstanceElement
                  ((Factory *)
                   &iterator_address.
                    super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,(Element *)0x0,instancer_name
                   ,tag,&this->attributes);
        ::std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>::vector
                  ((vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_> *)local_70
                  );
        sVar5 = ::std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>::size
                          (&this->container_address);
        ::std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>::reserve
                  ((vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_> *)local_70
                   ,sVar5 + 1);
        ::std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>::operator=
                  ((vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_> *)local_70
                   ,&this->container_address);
        DataAddressEntry::DataAddressEntry
                  ((DataAddressEntry *)
                   &iterator_index_address.
                    super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   new_element_ptr._M_t.
                   super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
                   super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
                   super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl._4_4_);
        ::std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>::push_back
                  ((vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_> *)local_70
                   ,(value_type *)
                    &iterator_index_address.
                     super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
        DataAddressEntry::~DataAddressEntry
                  ((DataAddressEntry *)
                   &iterator_index_address.
                    super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        local_19b[1] = (allocator<Rml::DataAddressEntry>)0x1;
        local_150 = (DataModel *)local_148;
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_170,"literal",&local_171);
        DataAddressEntry::DataAddressEntry((DataAddressEntry *)local_148,&local_170);
        local_150 = (DataModel *)(local_148 + 0x28);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_198,"int",&local_199);
        DataAddressEntry::DataAddressEntry((DataAddressEntry *)(local_148 + 0x28),&local_198);
        local_150 = (DataModel *)local_f8;
        DataAddressEntry::DataAddressEntry
                  ((DataAddressEntry *)local_150,
                   new_element_ptr._M_t.
                   super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
                   super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
                   super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl._4_4_);
        local_19b[1] = (allocator<Rml::DataAddressEntry>)0x0;
        local_f8._40_8_ = local_148;
        local_c8 = (pointer)0x3;
        ::std::allocator<Rml::DataAddressEntry>::allocator(local_19b);
        __l._M_len = (size_type)local_c8;
        __l._M_array = (iterator)local_f8._40_8_;
        ::std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>::vector
                  ((vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_> *)local_c0
                   ,__l,local_19b);
        ::std::allocator<Rml::DataAddressEntry>::~allocator(local_19b);
        local_230 = (DataAddressEntry *)(local_f8 + 0x28);
        do {
          local_230 = local_230 + -1;
          DataAddressEntry::~DataAddressEntry(local_230);
        } while (local_230 != (DataAddressEntry *)local_148);
        ::std::__cxx11::string::~string((string *)&local_198);
        ::std::allocator<char>::~allocator(&local_199);
        ::std::__cxx11::string::~string((string *)&local_170);
        ::std::allocator<char>::~allocator(&local_171);
        pvVar2 = variable.ptr;
        pEVar6 = ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::get
                           ((unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_> *)
                            &iterator_address.
                             super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
        ::std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>::vector
                  (&local_1b8,
                   (vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_> *)local_70
                  );
        DataModel::InsertAlias((DataModel *)pvVar2,pEVar6,&this->iterator_name,&local_1b8);
        ::std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>::~vector
                  (&local_1b8);
        pvVar2 = variable.ptr;
        pEVar6 = ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::get
                           ((unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_> *)
                            &iterator_address.
                             super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
        ::std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>::vector
                  ((vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_> *)
                   &new_element,
                   (vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_> *)local_c0
                  );
        DataModel::InsertAlias
                  ((DataModel *)pvVar2,pEVar6,&this->iterator_index_name,
                   (vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_> *)
                   &new_element);
        ::std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>::~vector
                  ((vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_> *)
                   &new_element);
        pEVar7 = Element::GetParentNode(this_00);
        ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::unique_ptr
                  ((unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_> *)(local_1e8 + 8),
                   (unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_> *)
                   &iterator_address.
                    super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        pEVar7 = Element::InsertBefore
                           (pEVar7,(unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_> *)
                                   (local_1e8 + 8),this_00);
        ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::~unique_ptr
                  ((unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_> *)(local_1e8 + 8));
        local_1d8 = pEVar7;
        ::std::vector<Rml::Element_*,_std::allocator<Rml::Element_*>_>::push_back
                  (&this->elements,&local_1d8);
        ppEVar8 = ::std::vector<Rml::Element_*,_std::allocator<Rml::Element_*>_>::operator[]
                            (&this->elements,
                             (long)new_element_ptr._M_t.
                                   super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>
                                   .super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl._4_4_)
        ;
        Element::SetInnerRML(*ppEVar8,&this->rml_contents);
        sVar5 = ::std::vector<Rml::Element_*,_std::allocator<Rml::Element_*>_>::size
                          (&this->elements);
        if (((int)sVar5 <=
             new_element_ptr._M_t.super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>.
             _M_t.super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
             super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl._4_4_) &&
           (bVar3 = Assert("RMLUI_ASSERT(i < (int)elements.size())",
                           "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/DataViewDefault.cpp"
                           ,0x228), !bVar3)) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        ::std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>::~vector
                  ((vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_> *)local_c0
                  );
        ::std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>::~vector
                  ((vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_> *)local_70
                  );
        ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::~unique_ptr
                  ((unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_> *)
                   &iterator_address.
                    super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      pvVar2 = variable.ptr;
      if (a <= new_element_ptr._M_t.
               super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
               super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
               super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl._4_4_) {
        ppEVar8 = ::std::vector<Rml::Element_*,_std::allocator<Rml::Element_*>_>::operator[]
                            (&this->elements,
                             (long)new_element_ptr._M_t.
                                   super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>
                                   .super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl._4_4_)
        ;
        DataModel::EraseAliases((DataModel *)pvVar2,*ppEVar8);
        ppEVar8 = ::std::vector<Rml::Element_*,_std::allocator<Rml::Element_*>_>::operator[]
                            (&this->elements,
                             (long)new_element_ptr._M_t.
                                   super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>
                                   .super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl._4_4_)
        ;
        pEVar7 = Element::GetParentNode(*ppEVar8);
        ::std::vector<Rml::Element_*,_std::allocator<Rml::Element_*>_>::operator[]
                  (&this->elements,
                   (long)new_element_ptr._M_t.
                         super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
                         super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
                         super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl._4_4_);
        Element::RemoveChild((Element *)local_1e8,pEVar7);
        ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::reset
                  ((unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_> *)local_1e8,(pointer)0x0)
        ;
        ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::~unique_ptr
                  ((unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_> *)local_1e8);
        ppEVar8 = ::std::vector<Rml::Element_*,_std::allocator<Rml::Element_*>_>::operator[]
                            (&this->elements,
                             (long)new_element_ptr._M_t.
                                   super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>
                                   .super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl._4_4_)
        ;
        *ppEVar8 = (value_type)0x0;
      }
    }
    if (a < b) {
      ::std::vector<Rml::Element_*,_std::allocator<Rml::Element_*>_>::resize
                (&this->elements,(long)a);
    }
  }
  return false;
}

Assistant:

bool DataViewFor::Update(DataModel& model)
{
	DataVariable variable = model.GetVariable(container_address);
	if (!variable)
		return false;

	bool result = false;
	const int size = variable.Size();
	const int num_elements = (int)elements.size();
	Element* element = GetElement();

	for (int i = 0; i < Math::Max(size, num_elements); i++)
	{
		if (i >= num_elements)
		{
			ElementPtr new_element_ptr = Factory::InstanceElement(nullptr, element->GetTagName(), element->GetTagName(), attributes);

			DataAddress iterator_address;
			iterator_address.reserve(container_address.size() + 1);
			iterator_address = container_address;
			iterator_address.push_back(DataAddressEntry(i));

			DataAddress iterator_index_address = {{"literal"}, {"int"}, {i}};

			model.InsertAlias(new_element_ptr.get(), iterator_name, std::move(iterator_address));
			model.InsertAlias(new_element_ptr.get(), iterator_index_name, std::move(iterator_index_address));

			Element* new_element = element->GetParentNode()->InsertBefore(std::move(new_element_ptr), element);
			elements.push_back(new_element);

			elements[i]->SetInnerRML(rml_contents);

			RMLUI_ASSERT(i < (int)elements.size());
		}
		if (i >= size)
		{
			model.EraseAliases(elements[i]);
			elements[i]->GetParentNode()->RemoveChild(elements[i]).reset();
			elements[i] = nullptr;
		}
	}

	if (num_elements > size)
		elements.resize(size);

	return result;
}